

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O0

void __thiscall
google::protobuf::io::FileInputStream::CopyingFileInputStream::~CopyingFileInputStream
          (CopyingFileInputStream *this)

{
  bool bVar1;
  LogMessage *pLVar2;
  char *value;
  LogFinisher local_49;
  LogMessage local_48;
  CopyingFileInputStream *local_10;
  CopyingFileInputStream *this_local;
  
  (this->super_CopyingInputStream)._vptr_CopyingInputStream =
       (_func_int **)&PTR__CopyingFileInputStream_008e9a70;
  local_10 = this;
  if (((this->close_on_delete_ & 1U) != 0) && (bVar1 = Close(this), !bVar1)) {
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/zero_copy_stream_impl.cc"
               ,0x75);
    pLVar2 = internal::LogMessage::operator<<(&local_48,"close() failed: ");
    value = strerror(this->errno_);
    pLVar2 = internal::LogMessage::operator<<(pLVar2,value);
    internal::LogFinisher::operator=(&local_49,pLVar2);
    internal::LogMessage::~LogMessage(&local_48);
  }
  CopyingInputStream::~CopyingInputStream(&this->super_CopyingInputStream);
  return;
}

Assistant:

FileInputStream::CopyingFileInputStream::~CopyingFileInputStream() {
  if (close_on_delete_) {
    if (!Close()) {
      GOOGLE_LOG(ERROR) << "close() failed: " << strerror(errno_);
    }
  }
}